

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void find_best_colors(j_decompress_ptr cinfo,int minc0,int minc1,int minc2,int numcolors,
                     JSAMPLE *colorlist,JSAMPLE *bestcolor)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  JSAMPLE local_498 [8];
  INT32 bestdist [128];
  INT32 inc2;
  INT32 inc1;
  INT32 inc0;
  INT32 xx2;
  INT32 xx1;
  INT32 xx0;
  INT32 dist2;
  INT32 dist1;
  INT32 dist0;
  JSAMPLE *cptr;
  INT32 *bptr;
  int local_38;
  int icolor;
  int i;
  int ic2;
  int ic1;
  int ic0;
  JSAMPLE *colorlist_local;
  int numcolors_local;
  int minc2_local;
  int minc1_local;
  int minc0_local;
  j_decompress_ptr cinfo_local;
  
  cptr = local_498;
  for (local_38 = 0x7f; -1 < local_38; local_38 = local_38 + -1) {
    cptr[0] = 0xff;
    cptr[1] = 0xff;
    cptr[2] = 0xff;
    cptr[3] = '\x7f';
    cptr[4] = '\0';
    cptr[5] = '\0';
    cptr[6] = '\0';
    cptr[7] = '\0';
    cptr = cptr + 8;
  }
  for (local_38 = 0; local_38 < numcolors; local_38 = local_38 + 1) {
    bVar1 = colorlist[local_38];
    uVar2 = (uint)bVar1;
    lVar3 = (long)(int)((minc0 - (uint)(*cinfo->colormap)[(int)uVar2]) * 2);
    lVar4 = (long)(int)((minc1 - (uint)cinfo->colormap[1][(int)uVar2]) * 3);
    lVar5 = (long)(int)(minc2 - (uint)cinfo->colormap[2][(int)uVar2]);
    dist1 = lVar5 * lVar5 + lVar4 * lVar4 + lVar3 * lVar3;
    xx1 = lVar3 * 0x20 + 0x100;
    bestdist[0x7f] = lVar5 * 0x10 + 0x40;
    cptr = local_498;
    dist0 = (INT32)bestcolor;
    for (ic2 = 3; -1 < ic2; ic2 = ic2 + -1) {
      dist2 = dist1;
      xx2 = lVar4 * 0x18 + 0x90;
      for (i = 7; -1 < i; i = i + -1) {
        xx0 = dist2;
        inc0 = bestdist[0x7f];
        for (icolor = 3; -1 < icolor; icolor = icolor + -1) {
          if (xx0 < *(long *)cptr) {
            *(INT32 *)cptr = xx0;
            *(byte *)dist0 = bVar1;
          }
          xx0 = inc0 + xx0;
          inc0 = inc0 + 0x80;
          cptr = cptr + 8;
          dist0 = dist0 + 1;
        }
        dist2 = xx2 + dist2;
        xx2 = xx2 + 0x120;
      }
      dist1 = xx1 + dist1;
      xx1 = xx1 + 0x200;
    }
  }
  return;
}

Assistant:

LOCAL(void)
find_best_colors (j_decompress_ptr cinfo, int minc0, int minc1, int minc2,
		  int numcolors, JSAMPLE colorlist[], JSAMPLE bestcolor[])
/* Find the closest colormap entry for each cell in the update box,
 * given the list of candidate colors prepared by find_nearby_colors.
 * Return the indexes of the closest entries in the bestcolor[] array.
 * This routine uses Thomas' incremental distance calculation method to
 * find the distance from a colormap entry to successive cells in the box.
 */
{
  int ic0, ic1, ic2;
  int i, icolor;
  register INT32 * bptr;	/* pointer into bestdist[] array */
  JSAMPLE * cptr;		/* pointer into bestcolor[] array */
  INT32 dist0, dist1;		/* initial distance values */
  register INT32 dist2;		/* current distance in inner loop */
  INT32 xx0, xx1;		/* distance increments */
  register INT32 xx2;
  INT32 inc0, inc1, inc2;	/* initial values for increments */
  /* This array holds the distance to the nearest-so-far color for each cell */
  INT32 bestdist[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Initialize best-distance for each cell of the update box */
  bptr = bestdist;
  for (i = BOX_C0_ELEMS*BOX_C1_ELEMS*BOX_C2_ELEMS-1; i >= 0; i--)
    *bptr++ = 0x7FFFFFFFL;
  
  /* For each color selected by find_nearby_colors,
   * compute its distance to the center of each cell in the box.
   * If that's less than best-so-far, update best distance and color number.
   */
  
  /* Nominal steps between cell centers ("x" in Thomas article) */
#define STEP_C0  ((1 << C0_SHIFT) * C0_SCALE)
#define STEP_C1  ((1 << C1_SHIFT) * C1_SCALE)
#define STEP_C2  ((1 << C2_SHIFT) * C2_SCALE)
  
  for (i = 0; i < numcolors; i++) {
    icolor = GETJSAMPLE(colorlist[i]);
    /* Compute (square of) distance from minc0/c1/c2 to this color */
    inc0 = (minc0 - GETJSAMPLE(cinfo->colormap[0][icolor])) * C0_SCALE;
    dist0 = inc0*inc0;
    inc1 = (minc1 - GETJSAMPLE(cinfo->colormap[1][icolor])) * C1_SCALE;
    dist0 += inc1*inc1;
    inc2 = (minc2 - GETJSAMPLE(cinfo->colormap[2][icolor])) * C2_SCALE;
    dist0 += inc2*inc2;
    /* Form the initial difference increments */
    inc0 = inc0 * (2 * STEP_C0) + STEP_C0 * STEP_C0;
    inc1 = inc1 * (2 * STEP_C1) + STEP_C1 * STEP_C1;
    inc2 = inc2 * (2 * STEP_C2) + STEP_C2 * STEP_C2;
    /* Now loop over all cells in box, updating distance per Thomas method */
    bptr = bestdist;
    cptr = bestcolor;
    xx0 = inc0;
    for (ic0 = BOX_C0_ELEMS-1; ic0 >= 0; ic0--) {
      dist1 = dist0;
      xx1 = inc1;
      for (ic1 = BOX_C1_ELEMS-1; ic1 >= 0; ic1--) {
	dist2 = dist1;
	xx2 = inc2;
	for (ic2 = BOX_C2_ELEMS-1; ic2 >= 0; ic2--) {
	  if (dist2 < *bptr) {
	    *bptr = dist2;
	    *cptr = (JSAMPLE) icolor;
	  }
	  dist2 += xx2;
	  xx2 += 2 * STEP_C2 * STEP_C2;
	  bptr++;
	  cptr++;
	}
	dist1 += xx1;
	xx1 += 2 * STEP_C1 * STEP_C1;
      }
      dist0 += xx0;
      xx0 += 2 * STEP_C0 * STEP_C0;
    }
  }
}